

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_json.c
# Opt level: O2

LY_ERR lyd_parse_json(ly_ctx *ctx,lysc_ext_instance *ext,lyd_node *parent,lyd_node **first_p,
                     ly_in *in,uint32_t parse_opts,uint32_t val_opts,uint32_t int_opts,
                     ly_set *parsed,ly_bool *subtree_sibling,lyd_ctx **lydctx_p)

{
  LY_ERR LVar1;
  LY_ERR LVar2;
  LYJSON_PARSER_STATUS LVar3;
  ly_err_item *plVar4;
  lyd_node **first_p_00;
  LY_ERR LVar5;
  lyd_json_ctx *plVar6;
  lyd_json_ctx *lydctx;
  ly_ctx *local_40;
  lyd_node **local_38;
  
  lydctx = (lyd_json_ctx *)0x0;
  LVar1 = lyd_parse_json_init(ctx,in,parse_opts,val_opts,&lydctx);
  plVar6 = lydctx;
  if (LVar1 != LY_SUCCESS) goto LAB_00132098;
  lydctx->int_opts = int_opts;
  lydctx->ext = ext;
  local_38 = first_p;
  LVar1 = lyd_parser_find_operation(parent,int_opts,&lydctx->op_node);
  plVar6 = lydctx;
  if (LVar1 != LY_SUCCESS) goto LAB_00132098;
  LVar1 = LY_SUCCESS;
  local_40 = ctx;
  do {
    LVar2 = lydjson_subtree_r(lydctx,parent,local_38,parsed);
    LVar5 = LVar1;
    if (LVar2 != LY_SUCCESS) {
      plVar4 = ly_err_last(lydctx->jsonctx->ctx);
      plVar6 = lydctx;
      LVar1 = LVar2;
      if ((LVar2 != LY_EVALID) || (lydctx == (lyd_json_ctx *)0x0)) goto LAB_00132098;
      if ((lydctx->val_opts & 4) == 0) goto LAB_001322e8;
      LVar1 = LY_EVALID;
      LVar5 = LY_EVALID;
      if (plVar4->vecode == LYVE_SYNTAX) goto LAB_00132098;
    }
    LVar1 = LVar5;
    LVar3 = lyjson_ctx_status(lydctx->jsonctx);
  } while (((int_opts & 0x20) != 0) && (LVar3 == LYJSON_OBJECT_NEXT));
  if (((int_opts & 0x40) == 0) ||
     ((*lydctx->jsonctx->in->current == '\0' || (LVar3 == LYJSON_OBJECT_CLOSED)))) {
LAB_001321b9:
    LVar5 = LVar1;
    if (((int_opts & 0xf) != 0) && (lydctx->op_node == (lyd_node *)0x0)) {
      ly_vlog(local_40,(char *)0x0,LYVE_DATA,"Missing the operation node.");
      plVar4 = ly_err_last(lydctx->jsonctx->ctx);
      if (lydctx == (lyd_json_ctx *)0x0) goto LAB_001322f0;
      if ((lydctx->val_opts & 4) == 0) goto LAB_001322e8;
      LVar1 = LY_EVALID;
      plVar6 = lydctx;
      LVar5 = LVar1;
      if (plVar4->vecode == LYVE_SYNTAX) goto LAB_00132098;
    }
    plVar6 = lydctx;
    first_p_00 = local_38;
    if (parent != (lyd_node *)0x0) {
      first_p_00 = lyd_node_child_p(parent);
    }
    LVar1 = lydjson_metadata_finish(plVar6,first_p_00);
    plVar6 = lydctx;
    if ((LVar1 == LY_SUCCESS) && (LVar1 = LVar5, (parse_opts >> 0x16 & 1) != 0)) {
      if (subtree_sibling == (ly_bool *)0x0) {
        __assert_fail("subtree_sibling",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_json.c"
                      ,0x773,
                      "LY_ERR lyd_parse_json(const struct ly_ctx *, const struct lysc_ext_instance *, struct lyd_node *, struct lyd_node **, struct ly_in *, uint32_t, uint32_t, uint32_t, struct ly_set *, ly_bool *, struct lyd_ctx **)"
                     );
      }
      if (LVar3 == LYJSON_OBJECT_NEXT) {
        *subtree_sibling = '\x01';
        ly_in_skip(lydctx->jsonctx->in,1);
        plVar6 = lydctx;
      }
      else {
        *subtree_sibling = '\0';
      }
    }
  }
  else {
    ly_vlog(local_40,(char *)0x0,LYVE_SYNTAX,"Unexpected sibling node.");
    plVar4 = ly_err_last(lydctx->jsonctx->ctx);
    if (lydctx != (lyd_json_ctx *)0x0) {
      if ((lydctx->val_opts & 4) != 0) {
        LVar1 = LY_EVALID;
        plVar6 = lydctx;
        if (plVar4->vecode == LYVE_SYNTAX) goto LAB_00132098;
        goto LAB_001321b9;
      }
LAB_001322e8:
      LVar1 = LY_EVALID;
      plVar6 = lydctx;
      goto LAB_00132098;
    }
LAB_001322f0:
    plVar6 = (lyd_json_ctx *)0x0;
    LVar1 = LY_EVALID;
  }
LAB_00132098:
  if (((plVar6 != (lyd_json_ctx *)0x0 & (byte)(parse_opts >> 0x10)) == 1) &&
     ((((plVar6->node_types).count != 0 || ((plVar6->meta_types).count != 0)) ||
      ((plVar6->node_when).count != 0)))) {
    __assert_fail("!(parse_opts & LYD_PARSE_ONLY) || !lydctx || (!lydctx->node_types.count && !lydctx->meta_types.count && !lydctx->node_when.count)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_json.c"
                  ,0x781,
                  "LY_ERR lyd_parse_json(const struct ly_ctx *, const struct lysc_ext_instance *, struct lyd_node *, struct lyd_node **, struct ly_in *, uint32_t, uint32_t, uint32_t, struct ly_set *, ly_bool *, struct lyd_ctx **)"
                 );
  }
  if ((LVar1 == LY_SUCCESS) ||
     (((plVar6 != (lyd_json_ctx *)0x0 && ((plVar6->val_opts & 4) != 0)) && (LVar1 == LY_EVALID)))) {
    *lydctx_p = (lyd_ctx *)plVar6;
    lyjson_ctx_free(plVar6->jsonctx);
    lydctx->jsonctx = (lyjson_ctx *)0x0;
  }
  else {
    lyd_json_ctx_free((lyd_ctx *)plVar6);
  }
  return LVar1;
}

Assistant:

LY_ERR
lyd_parse_json(const struct ly_ctx *ctx, const struct lysc_ext_instance *ext, struct lyd_node *parent,
        struct lyd_node **first_p, struct ly_in *in, uint32_t parse_opts, uint32_t val_opts, uint32_t int_opts,
        struct ly_set *parsed, ly_bool *subtree_sibling, struct lyd_ctx **lydctx_p)
{
    LY_ERR r, rc = LY_SUCCESS;
    struct lyd_json_ctx *lydctx = NULL;
    enum LYJSON_PARSER_STATUS status;

    rc = lyd_parse_json_init(ctx, in, parse_opts, val_opts, &lydctx);
    LY_CHECK_GOTO(rc, cleanup);

    lydctx->int_opts = int_opts;
    lydctx->ext = ext;

    /* find the operation node if it exists already */
    LY_CHECK_GOTO(rc = lyd_parser_find_operation(parent, int_opts, &lydctx->op_node), cleanup);

    /* read subtree(s) */
    do {
        r = lydjson_subtree_r(lydctx, parent, first_p, parsed);
        LY_DPARSER_ERR_GOTO(r, rc = r, lydctx, cleanup);

        status = lyjson_ctx_status(lydctx->jsonctx);

        if (!(int_opts & LYD_INTOPT_WITH_SIBLINGS)) {
            break;
        }
    } while (status == LYJSON_OBJECT_NEXT);

    if ((int_opts & LYD_INTOPT_NO_SIBLINGS) && lydctx->jsonctx->in->current[0] && (status != LYJSON_OBJECT_CLOSED)) {
        LOGVAL(ctx, LYVE_SYNTAX, "Unexpected sibling node.");
        r = LY_EVALID;
        LY_DPARSER_ERR_GOTO(r, rc = r, lydctx, cleanup);
    }
    if ((int_opts & (LYD_INTOPT_RPC | LYD_INTOPT_ACTION | LYD_INTOPT_NOTIF | LYD_INTOPT_REPLY)) && !lydctx->op_node) {
        LOGVAL(ctx, LYVE_DATA, "Missing the operation node.");
        r = LY_EVALID;
        LY_DPARSER_ERR_GOTO(r, rc = r, lydctx, cleanup);
    }

    /* finish linking metadata */
    r = lydjson_metadata_finish(lydctx, parent ? lyd_node_child_p(parent) : first_p);
    LY_CHECK_ERR_GOTO(r, rc = r, cleanup);

    if (parse_opts & LYD_PARSE_SUBTREE) {
        /* check for a sibling object */
        assert(subtree_sibling);
        if (status == LYJSON_OBJECT_NEXT) {
            *subtree_sibling = 1;

            /* move to the next object */
            ly_in_skip(lydctx->jsonctx->in, 1);
        } else {
            *subtree_sibling = 0;
        }
    }

cleanup:
    /* there should be no unresolved types stored */
    assert(!(parse_opts & LYD_PARSE_ONLY) || !lydctx || (!lydctx->node_types.count && !lydctx->meta_types.count &&
            !lydctx->node_when.count));

    if (rc && (!lydctx || !(lydctx->val_opts & LYD_VALIDATE_MULTI_ERROR) || (rc != LY_EVALID))) {
        lyd_json_ctx_free((struct lyd_ctx *)lydctx);
    } else {
        *lydctx_p = (struct lyd_ctx *)lydctx;

        /* the JSON context is no more needed, freeing it also stops logging line numbers which would be confusing now */
        lyjson_ctx_free(lydctx->jsonctx);
        lydctx->jsonctx = NULL;
    }
    return rc;
}